

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::ParseVariableTag(Parser *this,TiXmlHandle *xml_handle)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
  *this_00;
  pointer pNVar1;
  pointer pNVar2;
  pointer pSVar3;
  bool bVar4;
  TiXmlElement *pTVar5;
  mapped_type *ppVVar6;
  char *this_01;
  int i;
  ulong uVar7;
  int i_2;
  long lVar8;
  string local_270;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0 [32];
  string local_1d0 [32];
  StateVar prev_state;
  StateVar curr_state;
  
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)&curr_state,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)&prev_state,(char *)&curr_state);
  pTVar5 = util::tinyxml::TiXmlHandle::ToElement((TiXmlHandle *)&prev_state);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Cannot find Variable tag",(allocator<char> *)&prev_state);
  Ensure(this,pTVar5 != (TiXmlElement *)0x0,&local_270,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_270);
  pTVar5 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar5->super_TiXmlNode);
  do {
    if (pTVar5 == (TiXmlElement *)0x0) {
      this_00 = &this->variables_;
      lVar8 = 0x58;
      for (uVar7 = 0;
          pSVar3 = (this->prev_state_vars_).
                   super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(this->prev_state_vars_).
                                 super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0xc0);
          uVar7 = uVar7 + 1) {
        ppVVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                  ::operator[](this_00,(key_type *)
                                       ((long)&(pSVar3->super_NamedVar).super_Variable.
                                               _vptr_Variable + lVar8));
        *ppVVar6 = (mapped_type)((long)pSVar3 + lVar8 + -0x58);
        lVar8 = lVar8 + 0xc0;
      }
      lVar8 = 0x58;
      for (uVar7 = 0;
          pSVar3 = (this->curr_state_vars_).
                   super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(this->curr_state_vars_).
                                 super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0xc0);
          uVar7 = uVar7 + 1) {
        ppVVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                  ::operator[](this_00,(key_type *)
                                       ((long)&(pSVar3->super_NamedVar).super_Variable.
                                               _vptr_Variable + lVar8));
        *ppVVar6 = (mapped_type)((long)pSVar3 + lVar8 + -0x58);
        lVar8 = lVar8 + 0xc0;
      }
      lVar8 = 0x58;
      for (uVar7 = 0;
          pNVar1 = (this->obs_vars_).
                   super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(this->obs_vars_).
                                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x78);
          uVar7 = uVar7 + 1) {
        ppVVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                  ::operator[](this_00,(key_type *)
                                       ((long)&(pNVar1->super_Variable)._vptr_Variable + lVar8));
        *ppVVar6 = (mapped_type)((long)pNVar1 + lVar8 + -0x58);
        lVar8 = lVar8 + 0x78;
      }
      lVar8 = 0x58;
      for (uVar7 = 0;
          pNVar1 = (this->action_vars_).
                   super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(this->action_vars_).
                                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x78);
          uVar7 = uVar7 + 1) {
        ppVVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                  ::operator[](this_00,(key_type *)
                                       ((long)&(pNVar1->super_Variable)._vptr_Variable + lVar8));
        *ppVVar6 = (mapped_type)((long)pNVar1 + lVar8 + -0x58);
        lVar8 = lVar8 + 0x78;
      }
      lVar8 = 0x58;
      for (uVar7 = 0;
          pNVar1 = (this->reward_vars_).
                   super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(this->reward_vars_).
                                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x78);
          uVar7 = uVar7 + 1) {
        ppVVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                  ::operator[](this_00,(key_type *)
                                       ((long)&(pNVar1->super_Variable)._vptr_Variable + lVar8));
        *ppVVar6 = (mapped_type)((long)pNVar1 + lVar8 + -0x58);
        lVar8 = lVar8 + 0x78;
      }
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,((pTVar5->super_TiXmlNode).value.rep_)->str,
               (allocator<char> *)&prev_state);
    bVar4 = std::operator==(&type,"StateVar");
    if (bVar4) {
      CreateStateVar(&prev_state,this,pTVar5);
      std::__cxx11::string::string(local_1d0,(string *)&prev_state.prev_name_);
      std::__cxx11::string::_M_assign((string *)&prev_state.super_NamedVar.name_);
      std::__cxx11::string::~string(local_1d0);
      std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::push_back
                (&this->prev_state_vars_,&prev_state);
      StateVar::StateVar(&curr_state,&prev_state);
      std::__cxx11::string::string(local_1f0,(string *)&prev_state.curr_name_);
      std::__cxx11::string::_M_assign((string *)&curr_state.super_NamedVar.name_);
      std::__cxx11::string::~string(local_1f0);
      std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::push_back
                (&this->curr_state_vars_,&curr_state);
      StateVar::~StateVar(&curr_state);
      StateVar::~StateVar(&prev_state);
    }
    else {
      bVar4 = std::operator==(&type,"ObsVar");
      if (bVar4) {
        CreateObsVar(&prev_state.super_NamedVar,this,pTVar5);
        std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                  (&this->obs_vars_,&prev_state.super_NamedVar);
      }
      else {
        bVar4 = std::operator==(&type,"ActionVar");
        if (bVar4) {
          pNVar1 = (this->action_vars_).
                   super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pNVar2 = (this->action_vars_).
                   super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,"Only one action variable is allowed!",
                     (allocator<char> *)&prev_state);
          Ensure(this,pNVar2 == pNVar1,&local_210,(TiXmlBase *)0x0);
          std::__cxx11::string::~string((string *)&local_210);
          CreateActionVar(&prev_state.super_NamedVar,this,pTVar5);
          std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                    (&this->action_vars_,&prev_state.super_NamedVar);
        }
        else {
          this_01 = "RewardVar";
          bVar4 = std::operator==(&type,"RewardVar");
          if (!bVar4) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &prev_state,"Unknown XML tag: ",&type);
            std::operator+(&local_230,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &prev_state," encountered");
            Ensure(this,false,&local_230,(TiXmlBase *)pTVar5);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&prev_state);
            goto LAB_0015b498;
          }
          CreateRewardVar(&prev_state.super_NamedVar,(Parser *)this_01,pTVar5);
          std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                    (&this->reward_vars_,&prev_state.super_NamedVar);
        }
      }
      NamedVar::~NamedVar(&prev_state.super_NamedVar);
    }
LAB_0015b498:
    pTVar5 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar5->super_TiXmlNode);
    std::__cxx11::string::~string((string *)&type);
  } while( true );
}

Assistant:

void Parser::ParseVariableTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_Variable = xml_handle.FirstChild("pomdpx").FirstChild(
		"Variable").ToElement();

	Ensure(e_Variable != NULL, "Cannot find Variable tag");

	TiXmlElement* e_Var = e_Variable->FirstChildElement();
	while (e_Var != 0) {
		string type = e_Var->Value();
		if (type == "StateVar") {
			StateVar prev_state = CreateStateVar(e_Var);
			prev_state.name(prev_state.prev_name());
			prev_state_vars_.push_back(prev_state);

			StateVar curr_state = prev_state;
			curr_state.name(prev_state.curr_name());
			curr_state_vars_.push_back(curr_state);
		} else if (type == "ObsVar") {
			ObsVar obs = CreateObsVar(e_Var);
			obs_vars_.push_back(obs);
		} else if (type == "ActionVar") {
			Ensure(action_vars_.size() == 0,
				"Only one action variable is allowed!");

			ActionVar act = CreateActionVar(e_Var);
			action_vars_.push_back(act);
		} else if (type == "RewardVar") {
			RewardVar reward = CreateRewardVar(e_Var);
			reward_vars_.push_back(reward);
		} else {
			Ensure(false, "Unknown XML tag: " + type + " encountered", e_Var);
		}

		e_Var = e_Var->NextSiblingElement();
	}

	for (int i = 0; i < prev_state_vars_.size(); i++) {
		StateVar& var = prev_state_vars_[i];
		variables_[var.name()] = &var;
	}
	for (int i = 0; i < curr_state_vars_.size(); i++) {
		StateVar& var = curr_state_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < obs_vars_.size(); i++) {
		ObsVar& var = obs_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < action_vars_.size(); i++) {
		ActionVar& var = action_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < reward_vars_.size(); i++) {
		RewardVar& var = reward_vars_[i];
		variables_[var.name()] = &var;
	}
}